

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O0

bool __thiscall deqp::egl::MultiThreadedTest::execTest(MultiThreadedTest *this,TestThread *thread)

{
  int iVar1;
  TestStop *anon_var_0;
  int threadNdx_1;
  int threadNdx;
  NotSupportedError *anon_var_0_1;
  int threadNdx_3;
  int threadNdx_2;
  bool isOk;
  TestThread *thread_local;
  MultiThreadedTest *this_local;
  
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,thread);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool MultiThreadedTest::execTest (TestThread& thread)
{
	bool isOk = false;

	try
	{
		isOk = runThread(thread);
	}
	catch (const TestThread::TestStop&)
	{
		// Thread exited due to error in other thread
		throw;
	}
	catch (const tcu::NotSupportedError&)
	{
		// Set status of each thread
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			m_threads[threadNdx]->setStatus(TestThread::THREADSTATUS_NOT_SUPPORTED);

		// Release barriers
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		{
			m_barrierSemaphore1.increment();
			m_barrierSemaphore2.increment();
		}

		throw;
	}
	catch(...)
	{
		// Set status of each thread
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			m_threads[threadNdx]->setStatus(TestThread::THREADSTATUS_ERROR);

		// Release barriers
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		{
			m_barrierSemaphore1.increment();
			m_barrierSemaphore2.increment();
		}

		throw;
	}

	return isOk;
}